

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QtPrivate::QWellArray::setSelected(QWellArray *this,int row,int col)

{
  int column;
  int _t2;
  QMenu *pQVar1;
  int iVar2;
  int _t1;
  
  iVar2 = this->selRow;
  column = this->selCol;
  _t1 = -1;
  _t2 = _t1;
  if (-1 < (col | row)) {
    _t1 = row;
    _t2 = col;
  }
  this->selCol = _t2;
  this->selRow = _t1;
  updateCell(this,iVar2,column);
  iVar2 = this->selRow;
  updateCell(this,iVar2,this->selCol);
  if (-1 < _t1) {
    iVar2 = _t1;
    selected(this,_t1,_t2);
  }
  if (((((this->super_QWidget).data)->widget_attributes & 0x8000) != 0) &&
     (pQVar1 = qobject_cast_helper<QMenu*,QObject>
                         (*(QObject **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10)),
     pQVar1 != (QMenu *)0x0)) {
    QWidget::close(*(QWidget **)(*(long *)&(this->super_QWidget).field_0x8 + 0x10),iVar2);
    return;
  }
  return;
}

Assistant:

void QWellArray::setSelected(int row, int col)
{
    int oldRow = selRow;
    int oldCol = selCol;

    if (row < 0 || col < 0)
        row = col = -1;

    selCol = col;
    selRow = row;

    updateCell(oldRow, oldCol);
    updateCell(selRow, selCol);
    if (row >= 0)
        emit selected(row, col);

#if QT_CONFIG(menu)
    if (isVisible() && qobject_cast<QMenu*>(parentWidget()))
        parentWidget()->close();
#endif
}